

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

bool __thiscall Analyser::analyse_variable_declaration(Analyser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Error *pEVar4;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d2;
  allocator<char> local_2d1;
  string local_2d0;
  optional<Token> local_2b0;
  undefined1 local_281;
  undefined1 local_280 [7];
  bool has_initializer_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  optional<Token> local_228;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  char local_1d3;
  undefined1 local_1d2;
  allocator<char> local_1d1;
  undefined1 local_1d0 [5];
  char type_1;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  optional<Token> local_188;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  undefined1 local_131;
  undefined1 local_130 [7];
  bool has_initializer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8;
  optional<Token> local_d8;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  char local_81;
  undefined1 local_80 [7];
  char type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 local_50;
  undefined1 local_40 [8];
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  nextToken((optional<Token> *)local_40,this);
  bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
  if (bVar1) {
    pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
    TVar2 = Token::GetType(pTVar3);
    if (TVar2 == RESERVED_WORD) {
      std::optional<Token>::value((optional<Token> *)local_40);
      Token::GetValue((Token *)local_80);
      std::any_cast<std::__cxx11::string>(&local_70,(any *)local_80);
      bVar1 = std::operator==(&local_70,"const");
      std::__cxx11::string::~string((string *)&local_70);
      std::any::~any((any *)local_80);
      if (bVar1) {
        local_81 = analyse_type_specifier(this);
        if (local_81 == 'v') {
          local_aa = 1;
          pEVar4 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"can not identify a \'void\' variable",&local_a9);
          Error::Error(pEVar4,&local_a8,(long)this->_currentLine);
          local_aa = 0;
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
        do {
          nextToken(&local_d8,this);
          std::optional<Token>::operator=((optional<Token> *)local_40,&local_d8);
          std::optional<Token>::~optional(&local_d8);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
          if (!bVar1) {
LAB_001274be:
            local_fa = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,"Missing < init - declarator - list>",&local_f9);
            Error::Error(pEVar4,&local_f8,(long)this->_currentLine);
            local_fa = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
          TVar2 = Token::GetType(pTVar3);
          if (TVar2 != IDENTIFIER) goto LAB_001274be;
          std::optional<Token>::value((optional<Token> *)local_40);
          Token::GetValue((Token *)local_130);
          std::any_cast<std::__cxx11::string>(&local_120,(any *)local_130);
          addVariable(this,&local_120,true);
          std::__cxx11::string::~string((string *)&local_120);
          std::any::~any((any *)local_130);
          local_131 = analyse_initializer(this,local_81);
          if (!(bool)local_131) {
            local_15a = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_158,"Missing <initializer>",&local_159);
            Error::Error(pEVar4,&local_158,(long)this->_currentLine);
            local_15a = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          nextToken(&local_188,this);
          std::optional<Token>::operator=((optional<Token> *)local_40,&local_188);
          std::optional<Token>::~optional(&local_188);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
          if (!bVar1) {
            local_1aa = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,"Missing \';\'",&local_1a9);
            Error::Error(pEVar4,&local_1a8,(long)this->_currentLine);
            local_1aa = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
          TVar2 = Token::GetType(pTVar3);
        } while (TVar2 == COMMA_SIGH);
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
        TVar2 = Token::GetType(pTVar3);
        if (TVar2 != SEMICOLON) {
          local_1d2 = 1;
          pEVar4 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1d0,"Missing \';\'",&local_1d1);
          Error::Error(pEVar4,(string *)local_1d0,(long)this->_currentLine);
          local_1d2 = 0;
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
        this_local._7_1_ = true;
      }
      else {
        unreadToken(this);
        local_1d3 = analyse_type_specifier(this);
        if (local_1d3 == 'v') {
          local_1fa = 1;
          pEVar4 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"can not identify a \'void\' variable",&local_1f9);
          Error::Error(pEVar4,&local_1f8,(long)this->_currentLine);
          local_1fa = 0;
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
        do {
          nextToken(&local_228,this);
          std::optional<Token>::operator=((optional<Token> *)local_40,&local_228);
          std::optional<Token>::~optional(&local_228);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
          if (!bVar1) {
LAB_00127b5f:
            local_24a = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_248,"Missing < init - declarator - list>",&local_249);
            Error::Error(pEVar4,&local_248,(long)this->_currentLine);
            local_24a = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
          TVar2 = Token::GetType(pTVar3);
          if (TVar2 != IDENTIFIER) goto LAB_00127b5f;
          std::optional<Token>::value((optional<Token> *)local_40);
          Token::GetValue((Token *)local_280);
          std::any_cast<std::__cxx11::string>(&local_270,(any *)local_280);
          addVariable(this,&local_270,false);
          std::__cxx11::string::~string((string *)&local_270);
          std::any::~any((any *)local_280);
          local_281 = analyse_initializer(this,local_1d3);
          if (!(bool)local_281) {
            initializeVariable(this,local_1d3);
          }
          nextToken(&local_2b0,this);
          std::optional<Token>::operator=((optional<Token> *)local_40,&local_2b0);
          std::optional<Token>::~optional(&local_2b0);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
          if (!bVar1) {
            local_2d2 = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d0,"Missing \';\'",&local_2d1);
            Error::Error(pEVar4,&local_2d0,(long)this->_currentLine);
            local_2d2 = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
          TVar2 = Token::GetType(pTVar3);
        } while (TVar2 == COMMA_SIGH);
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
        TVar2 = Token::GetType(pTVar3);
        if (TVar2 != SEMICOLON) {
          pEVar4 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,"Missing \';\'",&local_2f9);
          Error::Error(pEVar4,&local_2f8,(long)this->_currentLine);
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
        this_local._7_1_ = true;
      }
      goto LAB_00127f97;
    }
  }
  unreadToken(this);
  this_local._7_1_ = false;
LAB_00127f97:
  local_50 = 1;
  std::optional<Token>::~optional((optional<Token> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Analyser::analyse_variable_declaration() {
	auto next = nextToken();
	if (!next.has_value() || (next.value().GetType() != TokenType::RESERVED_WORD)) {
		unreadToken();
		return false;
	}
	//const
	if (std::any_cast<std::string>(next.value().GetValue()) == "const") {
		char type = analyse_type_specifier();
		if (type == 'v') {
			throw Error("can not identify a 'void' variable", _currentLine);
		}
		do {
			//init - declarator - list
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing < init - declarator - list>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), true);
			bool has_initializer = analyse_initializer(type);
			if (!has_initializer) {
				throw Error("Missing <initializer>", _currentLine);
			}
			next = nextToken();
			if (!next.has_value()) {
				throw Error("Missing ';'", _currentLine);
			}
		} while (next.value().GetType() == TokenType::COMMA_SIGH);
		if (next.value().GetType() != TokenType::SEMICOLON) {
			throw Error("Missing ';'", _currentLine);
		}
		return true;
	}
	//non-const
	else {
		unreadToken();
		char type = analyse_type_specifier();
		if (type == 'v') {
			throw Error("can not identify a 'void' variable", _currentLine);
		}
		do {
			////init - declarator - list
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing < init - declarator - list>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), false);
			bool has_initializer = analyse_initializer(type);
			if (!has_initializer) {
				initializeVariable(type);
			}
			next = nextToken();
			if (!next.has_value()) {
				throw Error("Missing ';'", _currentLine);
			}
		} while (next.value().GetType() == TokenType::COMMA_SIGH);
		if (next.value().GetType() != TokenType::SEMICOLON) {
			throw Error("Missing ';'", _currentLine);
		}
		return true;
	}
}